

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O0

saucy_graph *
buildSim1Graph(Abc_Ntk_t *pNtk,coloring *c,Vec_Int_t *randVec,Vec_Int_t **iDep,Vec_Int_t **oDep)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int *pModel;
  int *__ptr;
  int *piVar5;
  int *piVar6;
  int numins;
  int numouts;
  int numOneOutputs;
  int *output;
  int *vPiValues;
  int *edg;
  int *adj;
  int e;
  int n;
  saucy_graph *g;
  int local_40;
  int k;
  int j;
  int i;
  Vec_Int_t **oDep_local;
  Vec_Int_t **iDep_local;
  Vec_Int_t *randVec_local;
  coloring *c_local;
  Abc_Ntk_t *pNtk_local;
  
  numins = 0;
  iVar1 = Abc_NtkPoNum(pNtk);
  iVar2 = Abc_NtkPiNum(pNtk);
  pModel = generateProperInputVector(pNtk,c,randVec);
  if (pModel == (int *)0x0) {
    pNtk_local = (Abc_Ntk_t *)0x0;
  }
  else {
    __ptr = Abc_NtkVerifySimulatePattern(pNtk,pModel);
    for (k = 0; k < iVar1; k = k + 1) {
      if (__ptr[k] != 0) {
        numins = numins + 1;
      }
    }
    pNtk_local = (Abc_Ntk_t *)malloc(0x18);
    piVar5 = ints(iVar1 + iVar2 + ABC_NTK_NETLIST);
    piVar6 = ints(iVar2 * numins * 2);
    pNtk_local->ntkType = iVar1 + iVar2;
    pNtk_local->ntkFunc = iVar2 * numins;
    pNtk_local->pName = (char *)piVar5;
    pNtk_local->pSpec = (char *)piVar6;
    *piVar5 = 0;
    for (k = 0; k < iVar1; k = k + 1) {
      if (__ptr[k] == 0) {
        piVar5[k + 1] = piVar5[k];
      }
      else {
        iVar4 = piVar5[k];
        iVar3 = Vec_IntSize(oDep[k]);
        piVar5[k + 1] = iVar4 + iVar3;
        local_40 = piVar5[k];
        g._4_4_ = 0;
        for (; local_40 < piVar5[k + 1]; local_40 = local_40 + 1) {
          iVar4 = Vec_IntEntry(oDep[k],g._4_4_);
          piVar6[local_40] = iVar4 + iVar1;
          g._4_4_ = g._4_4_ + 1;
        }
      }
    }
    for (k = 0; k < iVar2; k = k + 1) {
      piVar5[k + iVar1 + 1] = piVar5[k + iVar1];
      g._4_4_ = 0;
      local_40 = piVar5[k + iVar1];
      for (; iVar4 = Vec_IntSize(iDep[k]), g._4_4_ < iVar4; g._4_4_ = g._4_4_ + 1) {
        iVar4 = Vec_IntEntry(iDep[k],g._4_4_);
        if (__ptr[iVar4] != 0) {
          iVar4 = Vec_IntEntry(iDep[k],g._4_4_);
          piVar6[local_40] = iVar4;
          iVar4 = k + iVar1 + 1;
          piVar5[iVar4] = piVar5[iVar4] + 1;
          local_40 = local_40 + 1;
        }
      }
    }
    if (pModel != (int *)0x0) {
      free(pModel);
    }
    if (__ptr != (int *)0x0) {
      free(__ptr);
    }
  }
  return (saucy_graph *)pNtk_local;
}

Assistant:

static struct saucy_graph *
buildSim1Graph( Abc_Ntk_t * pNtk, struct coloring *c, Vec_Int_t * randVec, Vec_Int_t ** iDep, Vec_Int_t ** oDep )
{
    int i, j, k;
    struct saucy_graph *g;
    int n, e, *adj, *edg;
    int * vPiValues, * output;
    int numOneOutputs = 0;
    int numouts =  Abc_NtkPoNum(pNtk);
    int numins = Abc_NtkPiNum(pNtk);

    vPiValues = generateProperInputVector(pNtk, c, randVec);
    if (vPiValues == NULL) 
        return NULL;

    output = Abc_NtkVerifySimulatePattern(pNtk, vPiValues);

    for (i = 0; i < numouts; i++) {
        if (output[i])
            numOneOutputs++;
    }

    g = ABC_ALLOC(struct saucy_graph, 1);
    n = numouts + numins;
    e = numins * numOneOutputs;
    adj = ints(n+1);
    edg = ints(2*e);        
    g->n = n;
    g->e = e;
    g->adj = adj;
    g->edg = edg;   

    adj[0] = 0;
    for (i = 0; i < numouts; i++) {
        if (output[i]) {
            adj[i+1] = adj[i] + Vec_IntSize(oDep[i]);
            for (j = adj[i], k = 0; j < adj[i+1]; j++, k++)
                edg[j] = Vec_IntEntry(oDep[i], k) + numouts;
        } else {
            adj[i+1] = adj[i];
        }
    }

    for (i = 0; i < numins; i++) {
        adj[i+numouts+1] = adj[i+numouts];
        for (k = 0, j = adj[i+numouts]; k < Vec_IntSize(iDep[i]); k++) {
            if (output[Vec_IntEntry(iDep[i], k)]) {
                edg[j++] = Vec_IntEntry(iDep[i], k);
                adj[i+numouts+1]++;
            }
        }
    }

    /* print graph */
    /*for (i = 0; i < n; i++) {
        printf("%d: ", i);
        for (j = adj[i]; j < adj[i+1]; j++)
            printf("%d ", edg[j]);
        printf("\n");
    }*/

    ABC_FREE( vPiValues );  
    ABC_FREE( output );
    
    return g;   
}